

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValidateDataStructure.cpp
# Opt level: O1

void __thiscall
Assimp::ValidateDSProcess::Validate
          (ValidateDSProcess *this,aiAnimation *pAnimation,aiNodeAnim *pNodeAnim)

{
  double dVar1;
  char *pcVar2;
  long lVar3;
  ulong uVar4;
  double dVar5;
  double dVar6;
  
  Validate(this,&pNodeAnim->mNodeName);
  if (pNodeAnim->mNumPositionKeys == 0) {
    if ((pNodeAnim->mScalingKeys == (aiVectorKey *)0x0) && (pNodeAnim->mNumRotationKeys == 0)) {
      pcVar2 = "Empty node animation channel";
      goto LAB_0013ef6f;
    }
  }
  else {
    if (pNodeAnim->mPositionKeys == (aiVectorKey *)0x0) {
      pcVar2 = "aiNodeAnim::mPositionKeys is NULL (aiNodeAnim::mNumPositionKeys is %i)";
      goto LAB_0013ef58;
    }
    if (pNodeAnim->mNumPositionKeys != 0) {
      dVar5 = -100000000000.0;
      lVar3 = 0;
      uVar4 = 0;
      do {
        dVar6 = pAnimation->mDuration;
        if ((0.0 < dVar6) &&
           (dVar1 = *(double *)((long)&pNodeAnim->mPositionKeys->mTime + lVar3),
           dVar6 + 0.001 < dVar1)) {
          dVar5 = (double)(float)dVar1;
          dVar6 = (double)(float)dVar6;
          pcVar2 = 
          "aiNodeAnim::mPositionKeys[%i].mTime (%.5f) is larger than aiAnimation::mDuration (which is %.5f)"
          ;
          goto LAB_0013ef35;
        }
        if ((uVar4 != 0) &&
           (dVar6 = *(double *)((long)&pNodeAnim->mPositionKeys->mTime + lVar3), dVar6 <= dVar5)) {
          ReportWarning(this,
                        "aiNodeAnim::mPositionKeys[%i].mTime (%.5f) is smaller than aiAnimation::mPositionKeys[%i] (which is %.5f)"
                        ,(double)(float)dVar6,(double)(float)dVar5,uVar4 & 0xffffffff,
                        (ulong)((int)uVar4 - 1));
        }
        dVar5 = *(double *)((long)&pNodeAnim->mPositionKeys->mTime + lVar3);
        uVar4 = uVar4 + 1;
        lVar3 = lVar3 + 0x18;
      } while (uVar4 < pNodeAnim->mNumPositionKeys);
    }
  }
  if (pNodeAnim->mNumRotationKeys != 0) {
    if (pNodeAnim->mRotationKeys == (aiQuatKey *)0x0) {
      pcVar2 = "aiNodeAnim::mRotationKeys is NULL (aiNodeAnim::mNumRotationKeys is %i)";
      goto LAB_0013ef58;
    }
    if (pNodeAnim->mNumRotationKeys != 0) {
      dVar5 = -100000000000.0;
      lVar3 = 0;
      uVar4 = 0;
      do {
        dVar6 = pAnimation->mDuration;
        if ((0.0 < dVar6) &&
           (dVar1 = *(double *)((long)&pNodeAnim->mRotationKeys->mTime + lVar3),
           dVar6 + 0.001 < dVar1)) {
          dVar5 = (double)(float)dVar1;
          dVar6 = (double)(float)dVar6;
          pcVar2 = 
          "aiNodeAnim::mRotationKeys[%i].mTime (%.5f) is larger than aiAnimation::mDuration (which is %.5f)"
          ;
          goto LAB_0013ef35;
        }
        if ((uVar4 != 0) &&
           (dVar6 = *(double *)((long)&pNodeAnim->mRotationKeys->mTime + lVar3), dVar6 <= dVar5)) {
          ReportWarning(this,
                        "aiNodeAnim::mRotationKeys[%i].mTime (%.5f) is smaller than aiAnimation::mRotationKeys[%i] (which is %.5f)"
                        ,(double)(float)dVar6,(double)(float)dVar5,uVar4 & 0xffffffff,
                        (ulong)((int)uVar4 - 1));
        }
        dVar5 = *(double *)((long)&pNodeAnim->mRotationKeys->mTime + lVar3);
        uVar4 = uVar4 + 1;
        lVar3 = lVar3 + 0x18;
      } while (uVar4 < pNodeAnim->mNumRotationKeys);
    }
  }
  if (pNodeAnim->mNumScalingKeys != 0) {
    if (pNodeAnim->mScalingKeys == (aiVectorKey *)0x0) {
      pcVar2 = "aiNodeAnim::mScalingKeys is NULL (aiNodeAnim::mNumScalingKeys is %i)";
LAB_0013ef58:
      ReportError(this,pcVar2);
    }
    if (pNodeAnim->mNumScalingKeys != 0) {
      dVar5 = -100000000000.0;
      lVar3 = 0;
      uVar4 = 0;
      do {
        dVar6 = pAnimation->mDuration;
        if ((0.0 < dVar6) &&
           (dVar1 = *(double *)((long)&pNodeAnim->mScalingKeys->mTime + lVar3),
           dVar6 + 0.001 < dVar1)) {
          dVar5 = (double)(float)dVar1;
          dVar6 = (double)(float)dVar6;
          pcVar2 = 
          "aiNodeAnim::mScalingKeys[%i].mTime (%.5f) is larger than aiAnimation::mDuration (which is %.5f)"
          ;
LAB_0013ef35:
          ReportError(this,pcVar2,dVar5,dVar6,uVar4 & 0xffffffff);
        }
        if ((uVar4 != 0) &&
           (dVar6 = *(double *)((long)&pNodeAnim->mScalingKeys->mTime + lVar3), dVar6 <= dVar5)) {
          ReportWarning(this,
                        "aiNodeAnim::mScalingKeys[%i].mTime (%.5f) is smaller than aiAnimation::mScalingKeys[%i] (which is %.5f)"
                        ,(double)(float)dVar6,(double)(float)dVar5,uVar4 & 0xffffffff,
                        (ulong)((int)uVar4 - 1));
        }
        dVar5 = *(double *)((long)&pNodeAnim->mScalingKeys->mTime + lVar3);
        uVar4 = uVar4 + 1;
        lVar3 = lVar3 + 0x18;
      } while (uVar4 < pNodeAnim->mNumScalingKeys);
    }
  }
  if (((pNodeAnim->mNumScalingKeys != 0) || (pNodeAnim->mNumRotationKeys != 0)) ||
     (pNodeAnim->mNumPositionKeys != 0)) {
    return;
  }
  pcVar2 = "A node animation channel must have at least one subtrack";
LAB_0013ef6f:
  ReportError(this,pcVar2);
}

Assistant:

void ValidateDSProcess::Validate( const aiAnimation* pAnimation,
     const aiNodeAnim* pNodeAnim)
{
    Validate(&pNodeAnim->mNodeName);

    if (!pNodeAnim->mNumPositionKeys && !pNodeAnim->mScalingKeys && !pNodeAnim->mNumRotationKeys) {
        ReportError("Empty node animation channel");
    }
    // otherwise check whether one of the keys exceeds the total duration of the animation
    if (pNodeAnim->mNumPositionKeys)
    {
        if (!pNodeAnim->mPositionKeys)
        {
        	ReportError("aiNodeAnim::mPositionKeys is NULL (aiNodeAnim::mNumPositionKeys is %i)",
                pNodeAnim->mNumPositionKeys);
        }
        double dLast = -10e10;
        for (unsigned int i = 0; i < pNodeAnim->mNumPositionKeys;++i)
        {
            // ScenePreprocessor will compute the duration if still the default value
            // (Aramis) Add small epsilon, comparison tended to fail if max_time == duration,
            //  seems to be due the compilers register usage/width.
            if (pAnimation->mDuration > 0. && pNodeAnim->mPositionKeys[i].mTime > pAnimation->mDuration+0.001)
            {
                ReportError("aiNodeAnim::mPositionKeys[%i].mTime (%.5f) is larger "
                    "than aiAnimation::mDuration (which is %.5f)",i,
                    (float)pNodeAnim->mPositionKeys[i].mTime,
                    (float)pAnimation->mDuration);
            }
            if (i && pNodeAnim->mPositionKeys[i].mTime <= dLast)
            {
                ReportWarning("aiNodeAnim::mPositionKeys[%i].mTime (%.5f) is smaller "
                    "than aiAnimation::mPositionKeys[%i] (which is %.5f)",i,
                    (float)pNodeAnim->mPositionKeys[i].mTime,
                    i-1, (float)dLast);
            }
            dLast = pNodeAnim->mPositionKeys[i].mTime;
        }
    }
    // rotation keys
    if (pNodeAnim->mNumRotationKeys)
    {
        if (!pNodeAnim->mRotationKeys)
        {
            ReportError("aiNodeAnim::mRotationKeys is NULL (aiNodeAnim::mNumRotationKeys is %i)",
                pNodeAnim->mNumRotationKeys);
        }
        double dLast = -10e10;
        for (unsigned int i = 0; i < pNodeAnim->mNumRotationKeys;++i)
        {
            if (pAnimation->mDuration > 0. && pNodeAnim->mRotationKeys[i].mTime > pAnimation->mDuration+0.001)
            {
                ReportError("aiNodeAnim::mRotationKeys[%i].mTime (%.5f) is larger "
                    "than aiAnimation::mDuration (which is %.5f)",i,
                    (float)pNodeAnim->mRotationKeys[i].mTime,
                    (float)pAnimation->mDuration);
            }
            if (i && pNodeAnim->mRotationKeys[i].mTime <= dLast)
            {
                ReportWarning("aiNodeAnim::mRotationKeys[%i].mTime (%.5f) is smaller "
                    "than aiAnimation::mRotationKeys[%i] (which is %.5f)",i,
                    (float)pNodeAnim->mRotationKeys[i].mTime,
                    i-1, (float)dLast);
            }
            dLast = pNodeAnim->mRotationKeys[i].mTime;
        }
    }
    // scaling keys
    if (pNodeAnim->mNumScalingKeys)
    {
        if (!pNodeAnim->mScalingKeys)   {
            ReportError("aiNodeAnim::mScalingKeys is NULL (aiNodeAnim::mNumScalingKeys is %i)",
                pNodeAnim->mNumScalingKeys);
        }
        double dLast = -10e10;
        for (unsigned int i = 0; i < pNodeAnim->mNumScalingKeys;++i)
        {
            if (pAnimation->mDuration > 0. && pNodeAnim->mScalingKeys[i].mTime > pAnimation->mDuration+0.001)
            {
                ReportError("aiNodeAnim::mScalingKeys[%i].mTime (%.5f) is larger "
                    "than aiAnimation::mDuration (which is %.5f)",i,
                    (float)pNodeAnim->mScalingKeys[i].mTime,
                    (float)pAnimation->mDuration);
            }
            if (i && pNodeAnim->mScalingKeys[i].mTime <= dLast)
            {
                ReportWarning("aiNodeAnim::mScalingKeys[%i].mTime (%.5f) is smaller "
                    "than aiAnimation::mScalingKeys[%i] (which is %.5f)",i,
                    (float)pNodeAnim->mScalingKeys[i].mTime,
                    i-1, (float)dLast);
            }
            dLast = pNodeAnim->mScalingKeys[i].mTime;
        }
    }

    if (!pNodeAnim->mNumScalingKeys && !pNodeAnim->mNumRotationKeys &&
        !pNodeAnim->mNumPositionKeys)
    {
        ReportError("A node animation channel must have at least one subtrack");
    }
}